

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_stream.c
# Opt level: O0

int nghttp3_stream_write_settings(nghttp3_stream *stream,nghttp3_frame_entry *frent)

{
  uint8_t *puVar1;
  long in_RSI;
  nghttp3_settings *local_settings;
  nghttp3_settings_entry *iv;
  anon_struct_280_2_b05c8a45 fr;
  nghttp3_typed_buf tbuf;
  nghttp3_buf *chunk;
  int rv;
  size_t len;
  nghttp3_frame_settings *in_stack_fffffffffffffe78;
  nghttp3_stream *stream_00;
  undefined8 local_170;
  nghttp3_frame_settings *in_stack_fffffffffffffe98;
  nghttp3_typed_buf *tbuf_00;
  nghttp3_stream *stream_01;
  nghttp3_mem *need;
  nghttp3_stream *stream_02;
  nghttp3_typed_buf local_58;
  nghttp3_buf *local_30;
  int local_24;
  size_t local_20;
  long local_18;
  int local_4;
  
  local_18 = in_RSI;
  memset(&local_170,0,0x118);
  local_170 = 4;
  tbuf_00 = (nghttp3_typed_buf *)0x3;
  stream_00 = *(nghttp3_stream **)(local_18 + 0x28);
  stream_01 = (nghttp3_stream *)0x6;
  need = (stream_00->field_0).field_0.mem;
  stream_02 = (nghttp3_stream *)0x1;
  if (*(char *)((long)&stream_00->field_0 + 0x21) != '\0') {
    tbuf_00 = (nghttp3_typed_buf *)0x4;
  }
  if (*(char *)((long)&stream_00->field_0 + 0x20) != '\0') {
    *(undefined8 *)(&stack0xfffffffffffffea8 + (long)tbuf_00 * 0x10) = 8;
    *(undefined8 *)(&stack0xfffffffffffffeb0 + (long)tbuf_00 * 0x10) = 1;
    tbuf_00 = (nghttp3_typed_buf *)((long)&(tbuf_00->buf).begin + 1);
  }
  local_20 = nghttp3_frame_write_settings_len((int64_t *)tbuf_00,in_stack_fffffffffffffe98);
  local_24 = nghttp3_stream_ensure_chunk(stream_02,(size_t)need);
  local_4 = local_24;
  if (local_24 == 0) {
    local_30 = nghttp3_stream_get_chunk(stream_00);
    nghttp3_typed_buf_shared_init(&local_58,local_30);
    puVar1 = nghttp3_frame_write_settings((uint8_t *)stream_00,in_stack_fffffffffffffe78);
    local_30->last = puVar1;
    local_58.buf.last = local_30->last;
    local_4 = nghttp3_stream_outq_add(stream_01,tbuf_00);
  }
  return local_4;
}

Assistant:

int nghttp3_stream_write_settings(nghttp3_stream *stream,
                                  nghttp3_frame_entry *frent) {
  size_t len;
  int rv;
  nghttp3_buf *chunk;
  nghttp3_typed_buf tbuf;
  struct {
    nghttp3_frame_settings settings;
    nghttp3_settings_entry iv[15];
  } fr = {
    .settings =
      {
        .hd =
          {
            .type = NGHTTP3_FRAME_SETTINGS,
          },
        .niv = 3,
      },
  };
  nghttp3_settings_entry *iv;
  nghttp3_settings *local_settings = frent->aux.settings.local_settings;

  iv = &fr.settings.iv[0];

  iv[0].id = NGHTTP3_SETTINGS_ID_MAX_FIELD_SECTION_SIZE;
  iv[0].value = local_settings->max_field_section_size;
  iv[1].id = NGHTTP3_SETTINGS_ID_QPACK_MAX_TABLE_CAPACITY;
  iv[1].value = local_settings->qpack_max_dtable_capacity;
  iv[2].id = NGHTTP3_SETTINGS_ID_QPACK_BLOCKED_STREAMS;
  iv[2].value = local_settings->qpack_blocked_streams;

  if (local_settings->h3_datagram) {
    iv[fr.settings.niv].id = NGHTTP3_SETTINGS_ID_H3_DATAGRAM;
    iv[fr.settings.niv].value = 1;

    ++fr.settings.niv;
  }

  if (local_settings->enable_connect_protocol) {
    iv[fr.settings.niv].id = NGHTTP3_SETTINGS_ID_ENABLE_CONNECT_PROTOCOL;
    iv[fr.settings.niv].value = 1;

    ++fr.settings.niv;
  }

  len = nghttp3_frame_write_settings_len(&fr.settings.hd.length, &fr.settings);

  rv = nghttp3_stream_ensure_chunk(stream, len);
  if (rv != 0) {
    return rv;
  }

  chunk = nghttp3_stream_get_chunk(stream);
  nghttp3_typed_buf_shared_init(&tbuf, chunk);

  chunk->last = nghttp3_frame_write_settings(chunk->last, &fr.settings);

  tbuf.buf.last = chunk->last;

  return nghttp3_stream_outq_add(stream, &tbuf);
}